

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::TraceConfig_TriggerConfig::operator==
          (TraceConfig_TriggerConfig *this,TraceConfig_TriggerConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  bool local_19;
  TraceConfig_TriggerConfig *other_local;
  TraceConfig_TriggerConfig *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if ((_Var1) && (local_19 = false, this->trigger_mode_ == other->trigger_mode_)) {
    bVar2 = ::std::operator==(&this->triggers_,&other->triggers_);
    local_19 = false;
    if (bVar2) {
      local_19 = this->trigger_timeout_ms_ == other->trigger_timeout_ms_;
    }
  }
  return local_19;
}

Assistant:

bool TraceConfig_TriggerConfig::operator==(const TraceConfig_TriggerConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && trigger_mode_ == other.trigger_mode_
   && triggers_ == other.triggers_
   && trigger_timeout_ms_ == other.trigger_timeout_ms_;
}